

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeRTASBuilderCreateExp
          (ze_driver_handle_t hDriver,ze_rtas_builder_exp_desc_t *pDescriptor,
          ze_rtas_builder_exp_handle_t *phBuilder)

{
  object_t<_ze_rtas_builder_exp_handle_t_*> *poVar1;
  bad_alloc *anon_var_0;
  ze_pfnRTASBuilderCreateExp_t pfnCreateExp;
  dditable_t *dditable;
  ze_rtas_builder_exp_handle_t *pp_Stack_28;
  ze_result_t result;
  ze_rtas_builder_exp_handle_t *phBuilder_local;
  ze_rtas_builder_exp_desc_t *pDescriptor_local;
  ze_driver_handle_t hDriver_local;
  
  dditable._4_4_ = 0;
  pfnCreateExp = *(ze_pfnRTASBuilderCreateExp_t *)(hDriver + 8);
  if (*(code **)(pfnCreateExp + 0x28) == (code *)0x0) {
    hDriver_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    pDescriptor_local = *(ze_rtas_builder_exp_desc_t **)hDriver;
    pp_Stack_28 = phBuilder;
    phBuilder_local = (ze_rtas_builder_exp_handle_t *)pDescriptor;
    dditable._4_4_ = (**(code **)(pfnCreateExp + 0x28))(pDescriptor_local,pDescriptor,phBuilder);
    hDriver_local._4_4_ = dditable._4_4_;
    if (dditable._4_4_ == ZE_RESULT_SUCCESS) {
      poVar1 = singleton_factory_t<object_t<_ze_rtas_builder_exp_handle_t*>,_ze_rtas_builder_exp_handle_t*>
               ::getInstance<_ze_rtas_builder_exp_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_ze_rtas_builder_exp_handle_t*>,_ze_rtas_builder_exp_handle_t*>
                           *)(context + 0x600),pp_Stack_28,(dditable_t **)&pfnCreateExp);
      *pp_Stack_28 = (ze_rtas_builder_exp_handle_t)poVar1;
      hDriver_local._4_4_ = dditable._4_4_;
    }
  }
  return hDriver_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASBuilderCreateExp(
        ze_driver_handle_t hDriver,                     ///< [in] handle of driver object
        const ze_rtas_builder_exp_desc_t* pDescriptor,  ///< [in] pointer to builder descriptor
        ze_rtas_builder_exp_handle_t* phBuilder         ///< [out] handle of builder object
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_driver_object_t*>( hDriver )->dditable;
        auto pfnCreateExp = dditable->ze.RTASBuilderExp.pfnCreateExp;
        if( nullptr == pfnCreateExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDriver = reinterpret_cast<ze_driver_object_t*>( hDriver )->handle;

        // forward to device-driver
        result = pfnCreateExp( hDriver, pDescriptor, phBuilder );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phBuilder = reinterpret_cast<ze_rtas_builder_exp_handle_t>(
                context->ze_rtas_builder_exp_factory.getInstance( *phBuilder, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }